

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<std::complex<float>_>::SolveBICG
          (TPZMatrix<std::complex<float>_> *this,int64_t *numiterations,TPZSolver *preconditioner,
          TPZFMatrix<std::complex<float>_> *F,TPZFMatrix<std::complex<float>_> *result,REAL *tol)

{
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "virtual void TPZMatrix<std::complex<float>>::SolveBICG(int64_t &, TPZSolver &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, REAL &) [TVar = std::complex<float>]"
             ,0xa1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr," is currently not implemented ",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"for this type\nAborting...",0x19);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.cpp",
             0x32e);
}

Assistant:

int TPZMatrix<TVar>::SolveDirect( TPZFMatrix<TVar> &B , DecomposeType dt, std::list<int64_t> &singular) {
	
	switch ( dt ) {
		case ELU:
			return( Solve_LU( &B ,singular)  );
		case ECholesky:
			return( Solve_Cholesky( &B , singular)  );
		case ELDLt:
			return( Solve_LDLt( &B, singular )  );
		default:
			Error( "Solve  < Unknown decomposition type >" );
			break;
	}
	return ( 0 );
}